

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g2d.c
# Opt level: O0

void g2d_line_init_from_points(g2d_line_t *line,double *p0,double *p1)

{
  float fVar1;
  double dVar2;
  double dVar3;
  double mag;
  double *p1_local;
  double *p0_local;
  g2d_line_t *line_local;
  
  line->p[0] = *p0;
  line->p[1] = p0[1];
  line->u[0] = *p1 - *p0;
  line->u[1] = p1[1] - p0[1];
  dVar2 = sq(line->u[0]);
  dVar3 = sq(line->u[1]);
  fVar1 = sqrtf((float)(dVar2 + dVar3));
  line->u[0] = line->u[0] / (double)fVar1;
  line->u[1] = line->u[1] / (double)fVar1;
  return;
}

Assistant:

void g2d_line_init_from_points(g2d_line_t *line, const double p0[2], const double p1[2])
{
    line->p[0] = p0[0];
    line->p[1] = p0[1];
    line->u[0] = p1[0]-p0[0];
    line->u[1] = p1[1]-p0[1];
    double mag = sqrtf(sq(line->u[0]) + sq(line->u[1]));

    line->u[0] /= mag;
    line->u[1] /= mag;
}